

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Misc.h
# Opt level: O2

void Logger::printError<std::__cxx11::wstring,unsigned_short>
               (ErrorType type,wchar_t *text,
               basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *args,
               unsigned_short *args_1)

{
  wstring message;
  wstring local_30;
  
  formatString<std::__cxx11::wstring,unsigned_short>(&local_30,text,args,args_1);
  printError(type,&local_30);
  std::__cxx11::wstring::~wstring((wstring *)&local_30);
  return;
}

Assistant:

static void printError(ErrorType type, const wchar_t* text, const Args&... args)
	{
		std::wstring message = formatString(text,args...);
		printError(type,message);
	}